

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

int run_test_spawn_same_stdout_stderr(void)

{
  undefined1 auVar1 [16];
  int iVar2;
  __uid_t _Var3;
  uint uVar4;
  int extraout_EAX;
  uv_loop_t *puVar5;
  uv_loop_t *puVar6;
  __sighandler_t p_Var7;
  uv_process_options_t *loop;
  passwd *ppVar8;
  anon_union_8_2_13e1ed65_for_data aVar9;
  int *piVar10;
  ulong uVar11;
  ulong uVar12;
  uv_buf_t *buf;
  undefined1 *nread;
  uv_stream_t *stream;
  char *unaff_R12;
  uv_process_options_t *loop_00;
  uv_process_options_t *puVar13;
  int64_t eval_b;
  int64_t eval_b_2;
  uv_write_t write_req;
  uv_stdio_container_t stdio [3];
  uv_pipe_t out;
  uv_pipe_t in;
  undefined1 auStack_ef8 [24];
  uv_buf_t uStack_ee0;
  uv_fs_t uStack_ec8;
  uv_pipe_t uStack_d08;
  uv_stdio_container_t uStack_c20;
  undefined4 uStack_c10;
  undefined4 uStack_c00;
  anon_union_8_2_13e1ed65_for_data aStack_be8;
  long lStack_bb0;
  uint uStack_ba8;
  int iStack_ba4;
  uv_buf_t uStack_ba0;
  char acStack_b90 [16];
  uv_stdio_container_t uStack_b80;
  uv_write_t uStack_b70;
  uv_write_t uStack_aa8;
  uv_stream_t uStack_9e0;
  uv_fs_t uStack_8f8;
  anon_union_8_2_13e1ed65_for_data aStack_738;
  uv_loop_t *puStack_730;
  uv_signal_s *puStack_728;
  uv_signal_s *puStack_720;
  anon_union_8_2_13e1ed65_for_data aStack_718;
  char cStack_701;
  uv__queue *puStack_700;
  uv__queue *puStack_6f8;
  anon_union_8_2_13e1ed65_for_data aStack_6f0;
  uv_loop_t *puStack_6e8;
  uv_loop_t *apuStack_6e0 [2];
  uv_loop_t *puStack_6d0;
  cpu_set_t cStack_6c8;
  anon_union_8_2_13e1ed65_for_data aStack_640;
  char *pcStack_638;
  uv_loop_t *puStack_630;
  uv_process_options_t *puStack_628;
  long lStack_620;
  long lStack_618;
  anon_union_8_2_13e1ed65_for_data aStack_610;
  long lStack_608;
  long lStack_600;
  anon_union_8_2_13e1ed65_for_data aStack_5f8;
  long lStack_5f0;
  long lStack_5e8;
  char acStack_5d2 [10];
  anon_union_8_2_13e1ed65_for_data aStack_5c8;
  sigset_t sStack_598;
  code *pcStack_518;
  uv__io_t **ppuStack_510;
  uv__io_t **ppuStack_508;
  uv_buf_t uStack_500;
  uv_mutex_t uStack_4f0;
  uv_write_t uStack_4c8;
  undefined1 auStack_400 [264];
  uv_handle_t *local_2f8;
  uv_buf_t local_2f0;
  uv_write_t local_2e0;
  uv_stdio_container_t local_218;
  int local_208;
  uv_loop_t *local_200;
  undefined1 local_1e8 [464];
  
  uStack_500.len = (size_t)uStack_500.base;
  auStack_400._240_8_ = (uv__queue *)0x1be019;
  init_process_options("spawn_helper3",exit_cb);
  auStack_400._240_8_ = (uv__queue *)0x1be02a;
  local_2f0 = uv_buf_init("TEST",4);
  auStack_400._240_8_ = (uv__queue *)0x1be039;
  puVar5 = uv_default_loop();
  puVar6 = (uv_loop_t *)local_1e8;
  auStack_400._240_8_ = (uv__queue *)0x1be04e;
  uv_pipe_init(puVar5,(uv_pipe_t *)puVar6,0);
  auStack_400._240_8_ = (uv__queue *)0x1be053;
  puVar5 = uv_default_loop();
  aVar9.stream = (uv_stream_t *)(local_1e8 + 0xe8);
  auStack_400._240_8_ = (uv__queue *)0x1be068;
  uv_pipe_init(puVar5,(uv_pipe_t *)aVar9.stream,0);
  options.stdio = &local_218;
  puVar13 = &options;
  local_218.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  local_208 = 0x21;
  options.stdio_count = 2;
  auStack_400._240_8_ = (uv__queue *)0x1be0a2;
  local_218.data.stream = aVar9.stream;
  local_200 = puVar6;
  puVar5 = uv_default_loop();
  auStack_400._240_8_ = (uv__queue *)0x1be0b4;
  iVar2 = uv_spawn(puVar5,&process,&options);
  local_2e0.data = (void *)(long)iVar2;
  auStack_400._256_8_ = (uv_handle_t *)0x0;
  if ((uv_signal_s *)local_2e0.data == (uv_signal_s *)0x0) {
    auStack_400._240_8_ = (uv__queue *)0x1be0e2;
    iVar2 = uv_process_kill(&process,0);
    local_2e0.data = (void *)(long)iVar2;
    auStack_400._256_8_ = (uv_handle_t *)0x0;
    if ((uv_signal_s *)local_2e0.data != (uv_signal_s *)0x0) goto LAB_001be29f;
    auStack_400._240_8_ = (uv__queue *)0x1be125;
    iVar2 = uv_write(&local_2e0,(uv_stream_t *)(local_1e8 + 0xe8),&local_2f0,1,write_cb);
    auStack_400._256_8_ = SEXT48(iVar2);
    local_2f8 = (uv_handle_t *)0x0;
    if ((uv_handle_t *)auStack_400._256_8_ != (uv_handle_t *)0x0) goto LAB_001be2ae;
    auStack_400._240_8_ = (uv__queue *)0x1be160;
    iVar2 = uv_read_start((uv_stream_t *)local_1e8,on_alloc,on_read);
    auStack_400._256_8_ = SEXT48(iVar2);
    local_2f8 = (uv_handle_t *)0x0;
    if ((uv_handle_t *)auStack_400._256_8_ != (uv_handle_t *)0x0) goto LAB_001be2bd;
    auStack_400._256_8_ = SEXT48(exit_cb_called);
    local_2f8 = (uv_handle_t *)0x0;
    if ((uv_handle_t *)auStack_400._256_8_ != (uv_handle_t *)0x0) goto LAB_001be2cc;
    auStack_400._240_8_ = (uv__queue *)0x1be1aa;
    puVar5 = uv_default_loop();
    auStack_400._240_8_ = (uv__queue *)0x1be1b4;
    iVar2 = uv_run(puVar5,UV_RUN_DEFAULT);
    auStack_400._256_8_ = SEXT48(iVar2);
    local_2f8 = (uv_handle_t *)0x0;
    if ((uv_handle_t *)auStack_400._256_8_ != (uv_handle_t *)0x0) goto LAB_001be2db;
    auStack_400._256_8_ = (uv_handle_t *)0x1;
    local_2f8 = (uv_handle_t *)(long)exit_cb_called;
    if (local_2f8 != (uv_handle_t *)0x1) goto LAB_001be2ea;
    auStack_400._240_8_ = (uv__queue *)0x1be20c;
    iVar2 = strcmp(output,"TEST");
    auStack_400._256_8_ = SEXT48(iVar2);
    local_2f8 = (uv_handle_t *)0x0;
    if ((uv_handle_t *)auStack_400._256_8_ != (uv_handle_t *)0x0) goto LAB_001be2f9;
    auStack_400._240_8_ = (uv__queue *)0x1be231;
    puVar6 = uv_default_loop();
    auStack_400._240_8_ = (uv__queue *)0x1be245;
    uv_walk(puVar6,close_walk_cb,(void *)0x0);
    auStack_400._240_8_ = (uv__queue *)0x1be24f;
    uv_run(puVar6,UV_RUN_DEFAULT);
    auStack_400._256_8_ = (uv_handle_t *)0x0;
    auStack_400._240_8_ = (uv__queue *)0x1be25d;
    puVar5 = uv_default_loop();
    auStack_400._240_8_ = (uv__queue *)0x1be265;
    iVar2 = uv_loop_close(puVar5);
    local_2f8 = (uv_handle_t *)(long)iVar2;
    if ((uv_handle_t *)auStack_400._256_8_ == local_2f8) {
      auStack_400._240_8_ = (uv__queue *)0x1be281;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_400._240_8_ = (uv__queue *)0x1be29f;
    run_test_spawn_same_stdout_stderr_cold_1();
LAB_001be29f:
    auStack_400._240_8_ = (uv__queue *)0x1be2ae;
    run_test_spawn_same_stdout_stderr_cold_2();
LAB_001be2ae:
    auStack_400._240_8_ = (uv__queue *)0x1be2bd;
    run_test_spawn_same_stdout_stderr_cold_3();
LAB_001be2bd:
    auStack_400._240_8_ = (uv__queue *)0x1be2cc;
    run_test_spawn_same_stdout_stderr_cold_4();
LAB_001be2cc:
    auStack_400._240_8_ = (uv__queue *)0x1be2db;
    run_test_spawn_same_stdout_stderr_cold_5();
LAB_001be2db:
    auStack_400._240_8_ = (uv__queue *)0x1be2ea;
    run_test_spawn_same_stdout_stderr_cold_6();
LAB_001be2ea:
    auStack_400._240_8_ = (uv__queue *)0x1be2f9;
    run_test_spawn_same_stdout_stderr_cold_7();
LAB_001be2f9:
    auStack_400._240_8_ = (uv__queue *)0x1be308;
    run_test_spawn_same_stdout_stderr_cold_8();
  }
  auStack_400._240_8_ = run_test_spawn_closed_process_io;
  run_test_spawn_same_stdout_stderr_cold_9();
  pcStack_518 = (code *)0x1be334;
  auStack_400._232_8_ = puVar6;
  auStack_400._240_8_ = aVar9.stream;
  init_process_options("spawn_helper3",exit_cb);
  pcStack_518 = (code *)0x1be339;
  puVar5 = uv_default_loop();
  puVar6 = (uv_loop_t *)auStack_400;
  pcStack_518 = (code *)0x1be34e;
  uv_pipe_init(puVar5,(uv_pipe_t *)puVar6,0);
  options.stdio = (uv_stdio_container_t *)&uStack_4f0;
  loop_00 = &options;
  uStack_4f0.__data.__lock = 0x11;
  options.stdio_count = 1;
  pcStack_518 = (code *)0x1be37c;
  uStack_4f0._8_8_ = puVar6;
  close(0);
  pcStack_518 = (code *)0x1be381;
  puVar5 = uv_default_loop();
  pcStack_518 = (code *)0x1be393;
  iVar2 = uv_spawn(puVar5,&process,&options);
  uStack_4c8.data = (void *)(long)iVar2;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uStack_500.len;
  uStack_500 = (uv_buf_t)(auVar1 << 0x40);
  if (uStack_4c8.data == (void *)0x0) {
    pcStack_518 = (code *)0x1be3c4;
    uStack_500 = uv_buf_init(run_test_spawn_closed_process_io::buffer,0x18);
    pcStack_518 = (code *)0x1be3f1;
    iVar2 = uv_write(&uStack_4c8,(uv_stream_t *)auStack_400,&uStack_500,1,write_cb);
    ppuStack_508 = (uv__io_t **)(long)iVar2;
    ppuStack_510 = (uv__io_t **)0x0;
    if (ppuStack_508 != (uv__io_t **)0x0) goto LAB_001be4ed;
    pcStack_518 = (code *)0x1be414;
    puVar5 = uv_default_loop();
    pcStack_518 = (code *)0x1be41e;
    iVar2 = uv_run(puVar5,UV_RUN_DEFAULT);
    ppuStack_508 = (uv__io_t **)(long)iVar2;
    ppuStack_510 = (uv__io_t **)0x0;
    if (ppuStack_508 != (uv__io_t **)0x0) goto LAB_001be4fa;
    ppuStack_508 = (uv__io_t **)0x1;
    ppuStack_510 = (uv__io_t **)(long)exit_cb_called;
    if (ppuStack_510 != (uv__io_t **)0x1) goto LAB_001be507;
    ppuStack_508 = (uv__io_t **)0x2;
    ppuStack_510 = (uv__io_t **)(long)close_cb_called;
    if (ppuStack_510 != (uv__io_t **)0x2) goto LAB_001be514;
    pcStack_518 = (code *)0x1be487;
    puVar6 = uv_default_loop();
    pcStack_518 = (code *)0x1be49b;
    uv_walk(puVar6,close_walk_cb,(void *)0x0);
    pcStack_518 = (code *)0x1be4a5;
    uv_run(puVar6,UV_RUN_DEFAULT);
    ppuStack_508 = (uv__io_t **)0x0;
    pcStack_518 = (code *)0x1be4b3;
    puVar5 = uv_default_loop();
    pcStack_518 = (code *)0x1be4bb;
    iVar2 = uv_loop_close(puVar5);
    ppuStack_510 = (uv__io_t **)(long)iVar2;
    if (ppuStack_508 == ppuStack_510) {
      pcStack_518 = (code *)0x1be4d1;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_518 = (code *)0x1be4ed;
    run_test_spawn_closed_process_io_cold_1();
LAB_001be4ed:
    pcStack_518 = (code *)0x1be4fa;
    run_test_spawn_closed_process_io_cold_2();
LAB_001be4fa:
    pcStack_518 = (code *)0x1be507;
    run_test_spawn_closed_process_io_cold_3();
LAB_001be507:
    pcStack_518 = (code *)0x1be514;
    run_test_spawn_closed_process_io_cold_4();
LAB_001be514:
    pcStack_518 = (code *)0x1be521;
    run_test_spawn_closed_process_io_cold_5();
  }
  pcStack_518 = run_test_kill;
  run_test_spawn_closed_process_io_cold_6();
  pcStack_518 = (code *)puVar6;
  init_process_options("spawn_helper4",kill_cb);
  sigemptyset(&sStack_598);
  sigaddset(&sStack_598,0xf);
  iVar2 = pthread_sigmask(0,&sStack_598,(__sigset_t *)0x0);
  if (iVar2 == 0) {
    sStack_598.__val[0] = 0xffffffffffffffff;
    p_Var7 = signal(0xf,(__sighandler_t)0x1);
    if ((__sighandler_t)sStack_598.__val[0] == p_Var7) goto LAB_001be797;
    puVar6 = uv_default_loop();
    iVar2 = uv_spawn(puVar6,&process,&options);
    sStack_598.__val[0] = (ulong)iVar2;
    if ((__sighandler_t)sStack_598.__val[0] != (__sighandler_t)0x0) goto LAB_001be7a4;
    sigemptyset(&sStack_598);
    sigaddset(&sStack_598,0xf);
    iVar2 = pthread_sigmask(1,&sStack_598,(__sigset_t *)0x0);
    if (iVar2 != 0) goto LAB_001be7b1;
    sStack_598.__val[0] = 0xffffffffffffffff;
    p_Var7 = signal(0xf,(__sighandler_t)0x0);
    if ((__sighandler_t)sStack_598.__val[0] == p_Var7) goto LAB_001be7be;
    iVar2 = uv_kill(process.pid,0);
    sStack_598.__val[0] = (ulong)iVar2;
    if ((__sighandler_t)sStack_598.__val[0] != (__sighandler_t)0x0) goto LAB_001be7cb;
    iVar2 = uv_kill(process.pid,0xf);
    sStack_598.__val[0] = (ulong)iVar2;
    if ((__sighandler_t)sStack_598.__val[0] != (__sighandler_t)0x0) goto LAB_001be7d8;
    puVar6 = uv_default_loop();
    iVar2 = uv_run(puVar6,UV_RUN_DEFAULT);
    sStack_598.__val[0] = (ulong)iVar2;
    if ((__sighandler_t)sStack_598.__val[0] != (__sighandler_t)0x0) goto LAB_001be7e5;
    sStack_598.__val[0] = 1;
    if (exit_cb_called != 1) goto LAB_001be7f2;
    sStack_598.__val[0] = 1;
    if (close_cb_called != 1) goto LAB_001be7ff;
    loop = (uv_process_options_t *)uv_default_loop();
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    sStack_598.__val[0] = 0;
    puVar6 = uv_default_loop();
    iVar2 = uv_loop_close(puVar6);
    if ((__sighandler_t)sStack_598.__val[0] == (__sighandler_t)(long)iVar2) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_kill_cold_1();
LAB_001be797:
    run_test_kill_cold_11();
LAB_001be7a4:
    run_test_kill_cold_2();
LAB_001be7b1:
    run_test_kill_cold_3();
LAB_001be7be:
    run_test_kill_cold_10();
LAB_001be7cb:
    run_test_kill_cold_4();
LAB_001be7d8:
    run_test_kill_cold_5();
LAB_001be7e5:
    run_test_kill_cold_6();
LAB_001be7f2:
    run_test_kill_cold_7();
LAB_001be7ff:
    loop = (uv_process_options_t *)&sStack_598;
    run_test_kill_cold_8();
  }
  run_test_kill_cold_9();
  aStack_5f8 = (anon_union_8_2_13e1ed65_for_data)0x1be829;
  aStack_5c8 = (anon_union_8_2_13e1ed65_for_data)loop;
  _Var3 = getuid();
  if (_Var3 != 0) {
    aStack_5f8 = (anon_union_8_2_13e1ed65_for_data)0x1be9e8;
    run_test_spawn_setuid_setgid_cold_1();
    return 7;
  }
  aStack_5f8 = (anon_union_8_2_13e1ed65_for_data)0x1be844;
  init_process_options("spawn_helper_setuid_setgid",exit_cb);
  aStack_5f8 = (anon_union_8_2_13e1ed65_for_data)0x1be850;
  ppVar8 = getpwnam("nobody");
  if (ppVar8 == (passwd *)0x0) {
    aStack_5f8 = (anon_union_8_2_13e1ed65_for_data)0x1be9fb;
    run_test_spawn_setuid_setgid_cold_8();
LAB_001be9fb:
    aStack_5f8 = (anon_union_8_2_13e1ed65_for_data)0x1bea08;
    run_test_spawn_setuid_setgid_cold_2();
LAB_001bea08:
    aStack_5f8 = (anon_union_8_2_13e1ed65_for_data)0x1bea15;
    run_test_spawn_setuid_setgid_cold_3();
LAB_001bea15:
    aStack_5f8 = (anon_union_8_2_13e1ed65_for_data)0x1bea22;
    run_test_spawn_setuid_setgid_cold_4();
LAB_001bea22:
    aStack_5f8 = (anon_union_8_2_13e1ed65_for_data)0x1bea2f;
    run_test_spawn_setuid_setgid_cold_5();
  }
  else {
    options.uid = ppVar8->pw_uid;
    loop = &options;
    options.gid = ppVar8->pw_gid;
    puVar13 = (uv_process_options_t *)0x1f7b28;
    unaff_R12 = acStack_5d2;
    aStack_5f8 = (anon_union_8_2_13e1ed65_for_data)0x1be898;
    snprintf(unaff_R12,10,"%d",(ulong)ppVar8->pw_uid);
    loop_00 = (uv_process_options_t *)&stack0xfffffffffffffa24;
    aStack_5f8 = (anon_union_8_2_13e1ed65_for_data)0x1be8b3;
    snprintf((char *)loop_00,10,"%d",(ulong)ppVar8->pw_gid);
    options.args[2] = unaff_R12;
    options.args[3] = (char *)loop_00;
    options.flags = 3;
    aStack_5f8 = (anon_union_8_2_13e1ed65_for_data)0x1be8d8;
    puVar6 = uv_default_loop();
    aStack_5f8 = (anon_union_8_2_13e1ed65_for_data)0x1be8ea;
    iVar2 = uv_spawn(puVar6,&process,&options);
    if (iVar2 == -0xd) {
      aStack_5f8 = (anon_union_8_2_13e1ed65_for_data)0x1be9ef;
      run_test_spawn_setuid_setgid_cold_7();
      return 7;
    }
    lStack_5e8 = (long)iVar2;
    lStack_5f0 = 0;
    if (lStack_5e8 != 0) goto LAB_001be9fb;
    aStack_5f8 = (anon_union_8_2_13e1ed65_for_data)0x1be916;
    puVar6 = uv_default_loop();
    aStack_5f8 = (anon_union_8_2_13e1ed65_for_data)0x1be920;
    iVar2 = uv_run(puVar6,UV_RUN_DEFAULT);
    lStack_5e8 = (long)iVar2;
    lStack_5f0 = 0;
    if (lStack_5e8 != 0) goto LAB_001bea08;
    lStack_5e8 = 1;
    lStack_5f0 = (long)exit_cb_called;
    if (lStack_5f0 != 1) goto LAB_001bea15;
    lStack_5e8 = 1;
    lStack_5f0 = (long)close_cb_called;
    if (lStack_5f0 != 1) goto LAB_001bea22;
    aStack_5f8 = (anon_union_8_2_13e1ed65_for_data)0x1be989;
    loop_00 = (uv_process_options_t *)uv_default_loop();
    loop = (uv_process_options_t *)0x0;
    aStack_5f8 = (anon_union_8_2_13e1ed65_for_data)0x1be99f;
    uv_walk((uv_loop_t *)loop_00,close_walk_cb,(void *)0x0);
    aStack_5f8 = (anon_union_8_2_13e1ed65_for_data)0x1be9a9;
    uv_run((uv_loop_t *)loop_00,UV_RUN_DEFAULT);
    lStack_5e8 = 0;
    aStack_5f8 = (anon_union_8_2_13e1ed65_for_data)0x1be9b7;
    puVar6 = uv_default_loop();
    aStack_5f8 = (anon_union_8_2_13e1ed65_for_data)0x1be9bf;
    iVar2 = uv_loop_close(puVar6);
    lStack_5f0 = (long)iVar2;
    if (lStack_5e8 == lStack_5f0) {
      aStack_5f8 = (anon_union_8_2_13e1ed65_for_data)0x1be9d5;
      uv_library_shutdown();
      return 0;
    }
  }
  aStack_5f8.stream = (uv_stream_t *)run_test_spawn_setuid_fails;
  run_test_spawn_setuid_setgid_cold_6();
  aStack_610 = (anon_union_8_2_13e1ed65_for_data)0x1bea46;
  aStack_5f8 = (anon_union_8_2_13e1ed65_for_data)loop;
  _Var3 = getuid();
  if (_Var3 == 0) {
    aStack_610 = (anon_union_8_2_13e1ed65_for_data)0x1bea56;
    aVar9.stream = (uv_stream_t *)getpwnam("nobody");
    if ((uv_loop_t *)aVar9.stream == (uv_loop_t *)0x0) goto LAB_001bebe5;
    aStack_610 = (anon_union_8_2_13e1ed65_for_data)0x1bea6a;
    iVar2 = setgid(*(__gid_t *)&(aVar9.stream)->field_0x14);
    lStack_600 = (long)iVar2;
    lStack_608 = 0;
    loop = (uv_process_options_t *)aVar9.stream;
    if (lStack_600 != 0) goto LAB_001bebea;
    aStack_610 = (anon_union_8_2_13e1ed65_for_data)0x1bea90;
    iVar2 = setuid(*(uv_handle_type *)&((uv__queue *)&(aVar9.stream)->type)->next);
    lStack_600 = (long)iVar2;
    lStack_608 = 0;
    if (lStack_600 == 0) goto LAB_001beaae;
  }
  else {
LAB_001beaae:
    aStack_610 = (anon_union_8_2_13e1ed65_for_data)0x1beac1;
    init_process_options("spawn_helper1",fail_cb);
    loop = &options;
    options.uid = 0;
    options.flags = options.flags | 0x75;
    aStack_610 = (anon_union_8_2_13e1ed65_for_data)0x1beade;
    puVar6 = uv_default_loop();
    aStack_610 = (anon_union_8_2_13e1ed65_for_data)0x1beaf0;
    iVar2 = uv_spawn(puVar6,&process,&options);
    lStack_600 = (long)iVar2;
    lStack_608 = -1;
    if (lStack_600 == -1) {
      aStack_610 = (anon_union_8_2_13e1ed65_for_data)0x1beb13;
      puVar6 = uv_default_loop();
      aStack_610 = (anon_union_8_2_13e1ed65_for_data)0x1beb1d;
      iVar2 = uv_run(puVar6,UV_RUN_DEFAULT);
      lStack_600 = (long)iVar2;
      lStack_608 = 0;
      if (lStack_600 != 0) goto LAB_001bebbe;
      lStack_600 = (long)close_cb_called;
      lStack_608 = 0;
      if (lStack_600 != 0) goto LAB_001bebcb;
      aStack_610 = (anon_union_8_2_13e1ed65_for_data)0x1beb5f;
      loop = (uv_process_options_t *)uv_default_loop();
      aStack_610 = (anon_union_8_2_13e1ed65_for_data)0x1beb73;
      uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
      aStack_610 = (anon_union_8_2_13e1ed65_for_data)0x1beb7d;
      uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
      lStack_600 = 0;
      aStack_610 = (anon_union_8_2_13e1ed65_for_data)0x1beb8b;
      puVar6 = uv_default_loop();
      aStack_610 = (anon_union_8_2_13e1ed65_for_data)0x1beb93;
      iVar2 = uv_loop_close(puVar6);
      lStack_608 = (long)iVar2;
      if (lStack_600 == lStack_608) {
        aStack_610 = (anon_union_8_2_13e1ed65_for_data)0x1beba9;
        uv_library_shutdown();
        return 0;
      }
    }
    else {
      aStack_610 = (anon_union_8_2_13e1ed65_for_data)0x1bebbe;
      run_test_spawn_setuid_fails_cold_3();
LAB_001bebbe:
      aStack_610 = (anon_union_8_2_13e1ed65_for_data)0x1bebcb;
      run_test_spawn_setuid_fails_cold_4();
LAB_001bebcb:
      aStack_610 = (anon_union_8_2_13e1ed65_for_data)0x1bebd8;
      run_test_spawn_setuid_fails_cold_5();
    }
    aStack_610 = (anon_union_8_2_13e1ed65_for_data)0x1bebe5;
    run_test_spawn_setuid_fails_cold_6();
LAB_001bebe5:
    aStack_610 = (anon_union_8_2_13e1ed65_for_data)0x1bebea;
    run_test_spawn_setuid_fails_cold_7();
LAB_001bebea:
    aStack_610 = (anon_union_8_2_13e1ed65_for_data)0x1bebf7;
    run_test_spawn_setuid_fails_cold_1();
  }
  aStack_610.stream = (uv_stream_t *)run_test_spawn_setgid_fails;
  run_test_spawn_setuid_fails_cold_2();
  puStack_628 = (uv_process_options_t *)0x1bec0e;
  aStack_610 = (anon_union_8_2_13e1ed65_for_data)loop;
  _Var3 = getuid();
  if (_Var3 == 0) {
    puStack_628 = (uv_process_options_t *)0x1bec1e;
    aVar9.stream = (uv_stream_t *)getpwnam("nobody");
    if ((uv_loop_t *)aVar9.stream == (uv_loop_t *)0x0) goto LAB_001bedad;
    puStack_628 = (uv_process_options_t *)0x1bec32;
    iVar2 = setgid(*(__gid_t *)&(aVar9.stream)->field_0x14);
    lStack_618 = (long)iVar2;
    lStack_620 = 0;
    loop = (uv_process_options_t *)aVar9.stream;
    if (lStack_618 != 0) goto LAB_001bedb2;
    puStack_628 = (uv_process_options_t *)0x1bec58;
    iVar2 = setuid(*(uv_handle_type *)&((uv__queue *)&(aVar9.stream)->type)->next);
    lStack_618 = (long)iVar2;
    lStack_620 = 0;
    if (lStack_618 == 0) goto LAB_001bec76;
  }
  else {
LAB_001bec76:
    puStack_628 = (uv_process_options_t *)0x1bec89;
    init_process_options("spawn_helper1",fail_cb);
    loop = &options;
    options.flags = options.flags | 2;
    options.gid = 0;
    puStack_628 = (uv_process_options_t *)0x1beca6;
    puVar6 = uv_default_loop();
    puStack_628 = (uv_process_options_t *)0x1becb8;
    iVar2 = uv_spawn(puVar6,&process,&options);
    lStack_618 = (long)iVar2;
    lStack_620 = -1;
    if (lStack_618 == -1) {
      puStack_628 = (uv_process_options_t *)0x1becdb;
      puVar6 = uv_default_loop();
      puStack_628 = (uv_process_options_t *)0x1bece5;
      iVar2 = uv_run(puVar6,UV_RUN_DEFAULT);
      lStack_618 = (long)iVar2;
      lStack_620 = 0;
      if (lStack_618 != 0) goto LAB_001bed86;
      lStack_618 = (long)close_cb_called;
      lStack_620 = 0;
      if (lStack_618 != 0) goto LAB_001bed93;
      puStack_628 = (uv_process_options_t *)0x1bed27;
      loop = (uv_process_options_t *)uv_default_loop();
      puStack_628 = (uv_process_options_t *)0x1bed3b;
      uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
      puStack_628 = (uv_process_options_t *)0x1bed45;
      uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
      lStack_618 = 0;
      puStack_628 = (uv_process_options_t *)0x1bed53;
      puVar6 = uv_default_loop();
      puStack_628 = (uv_process_options_t *)0x1bed5b;
      iVar2 = uv_loop_close(puVar6);
      lStack_620 = (long)iVar2;
      if (lStack_618 == lStack_620) {
        puStack_628 = (uv_process_options_t *)0x1bed71;
        uv_library_shutdown();
        return 0;
      }
    }
    else {
      puStack_628 = (uv_process_options_t *)0x1bed86;
      run_test_spawn_setgid_fails_cold_3();
LAB_001bed86:
      puStack_628 = (uv_process_options_t *)0x1bed93;
      run_test_spawn_setgid_fails_cold_4();
LAB_001bed93:
      puStack_628 = (uv_process_options_t *)0x1beda0;
      run_test_spawn_setgid_fails_cold_5();
    }
    puStack_628 = (uv_process_options_t *)0x1bedad;
    run_test_spawn_setgid_fails_cold_6();
LAB_001bedad:
    puStack_628 = (uv_process_options_t *)0x1bedb2;
    run_test_spawn_setgid_fails_cold_7();
LAB_001bedb2:
    puStack_628 = (uv_process_options_t *)0x1bedbf;
    run_test_spawn_setgid_fails_cold_1();
  }
  puStack_628 = (uv_process_options_t *)run_test_spawn_affinity;
  run_test_spawn_setgid_fails_cold_2();
  aStack_6f0 = (anon_union_8_2_13e1ed65_for_data)0x1beddf;
  aStack_640 = (anon_union_8_2_13e1ed65_for_data)loop;
  pcStack_638 = unaff_R12;
  puStack_630 = (uv_loop_t *)loop_00;
  puStack_628 = puVar13;
  uVar4 = uv_cpumask_size();
  if ((int)uVar4 < 1) {
    aStack_6f0 = (anon_union_8_2_13e1ed65_for_data)0x1befd4;
    run_test_spawn_affinity_cold_1();
LAB_001befd4:
    aStack_6f0 = (anon_union_8_2_13e1ed65_for_data)0x1befe1;
    run_test_spawn_affinity_cold_2();
LAB_001befe1:
    aStack_6f0 = (anon_union_8_2_13e1ed65_for_data)0x1befee;
    run_test_spawn_affinity_cold_3();
LAB_001befee:
    puVar13 = loop;
    aStack_6f0 = (anon_union_8_2_13e1ed65_for_data)0x1beff3;
    run_test_spawn_affinity_cold_9();
LAB_001beff3:
    aStack_6f0 = (anon_union_8_2_13e1ed65_for_data)0x1beff8;
    run_test_spawn_affinity_cold_4();
LAB_001beff8:
    aStack_6f0 = (anon_union_8_2_13e1ed65_for_data)0x1beffd;
    run_test_spawn_affinity_cold_5();
LAB_001beffd:
    aStack_6f0 = (anon_union_8_2_13e1ed65_for_data)0x1bf002;
    run_test_spawn_affinity_cold_6();
LAB_001bf002:
    aStack_6f0 = (anon_union_8_2_13e1ed65_for_data)0x1bf007;
    run_test_spawn_affinity_cold_7();
  }
  else {
    loop._4_4_ = 0;
    loop._0_4_ = uVar4;
    cStack_6c8.__bits[0xe] = 0;
    cStack_6c8.__bits[0xf] = 0;
    cStack_6c8.__bits[0xc] = 0;
    cStack_6c8.__bits[0xd] = 0;
    cStack_6c8.__bits[10] = 0;
    cStack_6c8.__bits[0xb] = 0;
    cStack_6c8.__bits[8] = 0;
    cStack_6c8.__bits[9] = 0;
    cStack_6c8.__bits[6] = 0;
    cStack_6c8.__bits[7] = 0;
    cStack_6c8.__bits[4] = 0;
    cStack_6c8.__bits[5] = 0;
    cStack_6c8.__bits[2] = 0;
    cStack_6c8.__bits[3] = 0;
    cStack_6c8.__bits[0] = 0;
    cStack_6c8.__bits[1] = 0;
    loop_00 = (uv_process_options_t *)0x0;
    aStack_6f0 = (anon_union_8_2_13e1ed65_for_data)0x1bee1f;
    iVar2 = sched_getaffinity(0,0x80,&cStack_6c8);
    if (iVar2 != 0) {
      aStack_6f0 = (anon_union_8_2_13e1ed65_for_data)0x1bee28;
      piVar10 = __errno_location();
      loop_00 = (uv_process_options_t *)(long)*piVar10;
    }
    puStack_6e8 = (uv_loop_t *)0x0;
    apuStack_6e0[0] = (uv_loop_t *)loop_00;
    if ((uv_loop_t *)loop_00 != (uv_loop_t *)0x0) goto LAB_001befd4;
    uVar12 = 1;
    if (1 < (int)uVar4) {
      uVar12 = (ulong)uVar4;
    }
    uVar11 = 0;
    do {
      if ((uVar11 < 0x400) && ((cStack_6c8.__bits[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) != 0))
      goto LAB_001bee78;
      uVar11 = uVar11 + 1;
    } while (uVar12 != uVar11);
    uVar11 = (ulong)uVar4;
LAB_001bee78:
    loop_00 = (uv_process_options_t *)(uVar11 & 0xffffffff);
    puVar6 = (uv_loop_t *)(ulong)uVar4;
    puStack_6e8 = puVar6;
    apuStack_6e0[0] = (uv_loop_t *)loop_00;
    if (puVar6 <= loop_00) goto LAB_001befe1;
    aStack_6f0 = (anon_union_8_2_13e1ed65_for_data)0x1beeb4;
    snprintf((char *)apuStack_6e0,0xb,"%d",loop_00);
    aStack_6f0 = (anon_union_8_2_13e1ed65_for_data)0x1beec7;
    init_process_options("spawn_helper_affinity",exit_cb);
    aStack_6f0 = (anon_union_8_2_13e1ed65_for_data)0x1beed4;
    puVar13 = (uv_process_options_t *)calloc((size_t)puVar6,1);
    if ((uv_loop_t *)puVar13 == (uv_loop_t *)0x0) goto LAB_001befee;
    *(undefined1 *)
     ((long)((uv_loop_t *)loop_00)->reserved +
     (long)&((uv_stream_t *)((long)puVar13 + -0xd8))->write_queue) = 1;
    loop_00 = &options;
    options.cpumask = (char *)puVar13;
    options.cpumask_size = (size_t)puVar6;
    options.args[2] = (char *)apuStack_6e0;
    options.args[3] = "dummy";
    aStack_6f0 = (anon_union_8_2_13e1ed65_for_data)0x1bef1c;
    puVar6 = uv_default_loop();
    aStack_6f0 = (anon_union_8_2_13e1ed65_for_data)0x1bef2e;
    iVar2 = uv_spawn(puVar6,&process,&options);
    if (iVar2 != 0) goto LAB_001beff3;
    aStack_6f0 = (anon_union_8_2_13e1ed65_for_data)0x1bef3b;
    puVar6 = uv_default_loop();
    aStack_6f0 = (anon_union_8_2_13e1ed65_for_data)0x1bef45;
    iVar2 = uv_run(puVar6,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_001beff8;
    if (exit_cb_called != 1) goto LAB_001beffd;
    if (close_cb_called != 1) goto LAB_001bf002;
    aStack_6f0 = (anon_union_8_2_13e1ed65_for_data)0x1bef6f;
    free(puVar13);
    aStack_6f0 = (anon_union_8_2_13e1ed65_for_data)0x1bef74;
    puVar13 = (uv_process_options_t *)uv_default_loop();
    aStack_6f0 = (anon_union_8_2_13e1ed65_for_data)0x1bef88;
    uv_walk((uv_loop_t *)puVar13,close_walk_cb,(void *)0x0);
    aStack_6f0 = (anon_union_8_2_13e1ed65_for_data)0x1bef92;
    uv_run((uv_loop_t *)puVar13,UV_RUN_DEFAULT);
    puStack_6e8 = (uv_loop_t *)0x0;
    aStack_6f0 = (anon_union_8_2_13e1ed65_for_data)0x1bef9f;
    puVar6 = uv_default_loop();
    aStack_6f0 = (anon_union_8_2_13e1ed65_for_data)0x1befa7;
    iVar2 = uv_loop_close(puVar6);
    puStack_6d0 = (uv_loop_t *)(long)iVar2;
    if (puStack_6e8 == puStack_6d0) {
      aStack_6f0 = (anon_union_8_2_13e1ed65_for_data)0x1befbe;
      uv_library_shutdown();
      return 0;
    }
  }
  aStack_6f0.stream = (uv_stream_t *)run_test_spawn_affinity_invalid_mask;
  run_test_spawn_affinity_cold_8();
  aStack_718 = (anon_union_8_2_13e1ed65_for_data)0x1bf01e;
  aStack_6f0 = (anon_union_8_2_13e1ed65_for_data)puVar13;
  iVar2 = uv_cpumask_size();
  if (iVar2 < 1) {
    aStack_718 = (anon_union_8_2_13e1ed65_for_data)0x1bf0dd;
    run_test_spawn_affinity_invalid_mask_cold_1();
LAB_001bf0dd:
    aStack_718 = (anon_union_8_2_13e1ed65_for_data)0x1bf0e2;
    run_test_spawn_affinity_invalid_mask_cold_2();
LAB_001bf0e2:
    aStack_718 = (anon_union_8_2_13e1ed65_for_data)0x1bf0e7;
    run_test_spawn_affinity_invalid_mask_cold_3();
  }
  else {
    aStack_718 = (anon_union_8_2_13e1ed65_for_data)0x1bf039;
    init_process_options("",exit_cb);
    options.cpumask = &cStack_701;
    cStack_701 = '\0';
    options.cpumask_size = 0;
    puVar13 = &options;
    aStack_718 = (anon_union_8_2_13e1ed65_for_data)0x1bf05f;
    puVar6 = uv_default_loop();
    aStack_718 = (anon_union_8_2_13e1ed65_for_data)0x1bf071;
    iVar2 = uv_spawn(puVar6,&process,&options);
    if (iVar2 != -0x16) goto LAB_001bf0dd;
    if (exit_cb_called != 0) goto LAB_001bf0e2;
    aStack_718 = (anon_union_8_2_13e1ed65_for_data)0x1bf084;
    puVar13 = (uv_process_options_t *)uv_default_loop();
    aStack_718 = (anon_union_8_2_13e1ed65_for_data)0x1bf098;
    uv_walk((uv_loop_t *)puVar13,close_walk_cb,(void *)0x0);
    aStack_718 = (anon_union_8_2_13e1ed65_for_data)0x1bf0a2;
    uv_run((uv_loop_t *)puVar13,UV_RUN_DEFAULT);
    puStack_6f8 = (uv__queue *)0x0;
    aStack_718 = (anon_union_8_2_13e1ed65_for_data)0x1bf0b0;
    puVar6 = uv_default_loop();
    aStack_718 = (anon_union_8_2_13e1ed65_for_data)0x1bf0b8;
    iVar2 = uv_loop_close(puVar6);
    puStack_700 = (uv__queue *)(long)iVar2;
    if (puStack_6f8 == puStack_700) {
      aStack_718 = (anon_union_8_2_13e1ed65_for_data)0x1bf0d0;
      uv_library_shutdown();
      return 0;
    }
  }
  aStack_718.stream = (uv_stream_t *)run_test_spawn_auto_unref;
  run_test_spawn_affinity_invalid_mask_cold_4();
  puStack_730 = (uv_loop_t *)0x1bf109;
  aStack_718 = (anon_union_8_2_13e1ed65_for_data)puVar13;
  init_process_options("spawn_helper1",(uv_exit_cb)0x0);
  puStack_730 = (uv_loop_t *)0x1bf10e;
  puVar6 = uv_default_loop();
  puStack_730 = (uv_loop_t *)0x1bf124;
  iVar2 = uv_spawn(puVar6,&process,&options);
  puStack_720 = (uv_signal_s *)(long)iVar2;
  puStack_728 = (uv_signal_s *)0x0;
  if (puStack_720 == (uv_signal_s *)0x0) {
    puStack_730 = (uv_loop_t *)0x1bf147;
    puVar6 = uv_default_loop();
    puStack_730 = (uv_loop_t *)0x1bf151;
    iVar2 = uv_run(puVar6,UV_RUN_DEFAULT);
    puStack_720 = (uv_signal_s *)(long)iVar2;
    puStack_728 = (uv_signal_s *)0x0;
    if (puStack_720 != (uv_signal_s *)0x0) goto LAB_001bf262;
    puStack_730 = (uv_loop_t *)0x1bf17b;
    iVar2 = uv_is_closing((uv_handle_t *)&process);
    puStack_720 = (uv_signal_s *)(long)iVar2;
    puStack_728 = (uv_signal_s *)0x0;
    if (puStack_720 != (uv_signal_s *)0x0) goto LAB_001bf26f;
    puStack_730 = (uv_loop_t *)0x1bf1a7;
    uv_close((uv_handle_t *)&process,(uv_close_cb)0x0);
    puStack_730 = (uv_loop_t *)0x1bf1ac;
    puVar6 = uv_default_loop();
    puStack_730 = (uv_loop_t *)0x1bf1b6;
    iVar2 = uv_run(puVar6,UV_RUN_DEFAULT);
    puStack_720 = (uv_signal_s *)(long)iVar2;
    puStack_728 = (uv_signal_s *)0x0;
    if (puStack_720 != (uv_signal_s *)0x0) goto LAB_001bf27c;
    puStack_720 = (uv_signal_s *)0x1;
    puStack_730 = (uv_loop_t *)0x1bf1e9;
    iVar2 = uv_is_closing((uv_handle_t *)&process);
    puStack_728 = (uv_signal_s *)(long)iVar2;
    if (puStack_720 != puStack_728) goto LAB_001bf289;
    puStack_730 = (uv_loop_t *)0x1bf203;
    puVar13 = (uv_process_options_t *)uv_default_loop();
    puStack_730 = (uv_loop_t *)0x1bf217;
    uv_walk((uv_loop_t *)puVar13,close_walk_cb,(void *)0x0);
    puStack_730 = (uv_loop_t *)0x1bf221;
    uv_run((uv_loop_t *)puVar13,UV_RUN_DEFAULT);
    puStack_720 = (uv_signal_s *)0x0;
    puStack_730 = (uv_loop_t *)0x1bf22f;
    puVar6 = uv_default_loop();
    puStack_730 = (uv_loop_t *)0x1bf237;
    iVar2 = uv_loop_close(puVar6);
    puStack_728 = (uv_signal_s *)(long)iVar2;
    if (puStack_720 == puStack_728) {
      puStack_730 = (uv_loop_t *)0x1bf24d;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_730 = (uv_loop_t *)0x1bf262;
    run_test_spawn_auto_unref_cold_1();
LAB_001bf262:
    puStack_730 = (uv_loop_t *)0x1bf26f;
    run_test_spawn_auto_unref_cold_2();
LAB_001bf26f:
    puStack_730 = (uv_loop_t *)0x1bf27c;
    run_test_spawn_auto_unref_cold_3();
LAB_001bf27c:
    puStack_730 = (uv_loop_t *)0x1bf289;
    run_test_spawn_auto_unref_cold_4();
LAB_001bf289:
    puStack_730 = (uv_loop_t *)0x1bf296;
    run_test_spawn_auto_unref_cold_5();
  }
  puStack_730 = (uv_loop_t *)run_test_spawn_fs_open;
  run_test_spawn_auto_unref_cold_6();
  builtin_strncpy(acStack_b90,"/dev/null",10);
  aStack_738 = (anon_union_8_2_13e1ed65_for_data)puVar13;
  puStack_730 = (uv_loop_t *)loop_00;
  iVar2 = uv_fs_open((uv_loop_t *)0x0,&uStack_8f8,acStack_b90,2,0,(uv_fs_cb)0x0);
  uStack_9e0.data = (void *)(long)iVar2;
  uStack_aa8.data = (void *)0x0;
  if (uStack_9e0.data == (void *)0x0) {
    uStack_ba8 = (undefined4)uStack_8f8.result;
    init_process_options("spawn_helper8",exit_cb);
    puVar6 = uv_default_loop();
    puVar13 = (uv_process_options_t *)&uStack_9e0;
    iVar2 = uv_pipe_init(puVar6,(uv_pipe_t *)puVar13,0);
    uStack_aa8.data = (void *)(long)iVar2;
    uStack_b70.data = (void *)0x0;
    if (uStack_aa8.data != (void *)0x0) goto LAB_001bf5ba;
    options.stdio = &uStack_b80;
    uStack_b80.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
    options.stdio_count = 1;
    uStack_b80.data.stream = (uv_stream_t *)puVar13;
    iStack_ba4 = dup(uStack_ba8);
    puVar6 = uv_default_loop();
    iVar2 = uv_spawn(puVar6,&process,&options);
    uStack_aa8.data = (void *)(long)iVar2;
    uStack_b70.data = (void *)0x0;
    if (uStack_aa8.data != (void *)0x0) goto LAB_001bf5cc;
    uStack_ba0 = uv_buf_init((char *)&uStack_ba8,4);
    iVar2 = uv_write(&uStack_aa8,&uStack_9e0,&uStack_ba0,1,write_null_cb);
    uStack_b70.data = (void *)(long)iVar2;
    if (uStack_b70.data != (void *)0x0) goto LAB_001bf5de;
    uStack_ba0 = uv_buf_init((char *)&iStack_ba4,4);
    iVar2 = uv_write(&uStack_b70,&uStack_9e0,&uStack_ba0,1,write_cb);
    lStack_bb0 = 0;
    if (iVar2 != 0) goto LAB_001bf5ed;
    puVar6 = uv_default_loop();
    iVar2 = uv_run(puVar6,UV_RUN_DEFAULT);
    lStack_bb0 = 0;
    if (iVar2 != 0) goto LAB_001bf5fc;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&uStack_8f8,uStack_ba8,(uv_fs_cb)0x0);
    lStack_bb0 = 0;
    if (iVar2 != 0) goto LAB_001bf60b;
    lStack_bb0 = (long)exit_cb_called;
    if (lStack_bb0 != 1) goto LAB_001bf61a;
    lStack_bb0 = (long)close_cb_called;
    if (lStack_bb0 != 2) goto LAB_001bf629;
    puVar13 = (uv_process_options_t *)uv_default_loop();
    uv_walk((uv_loop_t *)puVar13,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)puVar13,UV_RUN_DEFAULT);
    puVar6 = uv_default_loop();
    iVar2 = uv_loop_close(puVar6);
    lStack_bb0 = (long)iVar2;
    if (lStack_bb0 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_fs_open_cold_1();
LAB_001bf5ba:
    run_test_spawn_fs_open_cold_2();
LAB_001bf5cc:
    run_test_spawn_fs_open_cold_3();
LAB_001bf5de:
    run_test_spawn_fs_open_cold_4();
LAB_001bf5ed:
    run_test_spawn_fs_open_cold_5();
LAB_001bf5fc:
    run_test_spawn_fs_open_cold_6();
LAB_001bf60b:
    run_test_spawn_fs_open_cold_7();
LAB_001bf61a:
    run_test_spawn_fs_open_cold_8();
LAB_001bf629:
    run_test_spawn_fs_open_cold_9();
  }
  iVar2 = (int)&lStack_bb0;
  run_test_spawn_fs_open_cold_10();
  if (iVar2 == 0) {
    return 0;
  }
  write_null_cb_cold_1();
  aStack_be8 = (anon_union_8_2_13e1ed65_for_data)puVar13;
  uStack_ee0 = uv_buf_init("",1);
  iVar2 = uv_pipe((uv_os_fd_t *)(auStack_ef8 + 0x10),0,0);
  if (iVar2 == 0) {
    init_process_options("spawn_helper4",exit_cb);
    options.stdio_count = 3;
    options.stdio = &uStack_c20;
    uStack_c20.flags = UV_INHERIT_FD;
    uStack_c20.data.file = auStack_ef8._16_4_;
    uStack_c10 = 0;
    uStack_c00 = 0;
    puVar6 = uv_default_loop();
    iVar2 = uv_spawn(puVar6,&process,&options);
    uStack_ec8.data = (void *)(long)iVar2;
    uStack_d08.data = (void *)0x0;
    if ((uv_handle_t *)uStack_ec8.data != (uv_handle_t *)0x0) goto LAB_001bfaf5;
    uv_unref((uv_handle_t *)&process);
    puVar6 = uv_default_loop();
    iVar2 = uv_pipe_init(puVar6,&uStack_d08,0);
    uStack_ec8.data = (void *)(long)iVar2;
    auStack_ef8._0_8_ = (uv_loop_t *)0x0;
    if ((uv_handle_t *)uStack_ec8.data != (uv_handle_t *)0x0) goto LAB_001bfb07;
    iVar2 = uv_pipe_open(&uStack_d08,auStack_ef8._16_4_);
    uStack_ec8.data = (void *)(long)iVar2;
    auStack_ef8._0_8_ = (uv_loop_t *)0x0;
    if ((uv_handle_t *)uStack_ec8.data != (uv_handle_t *)0x0) goto LAB_001bfb16;
    auStack_ef8._16_4_ = ~UV_UNKNOWN_HANDLE;
    iVar2 = uv_read_start((uv_stream_t *)&uStack_d08,on_alloc,on_read_once);
    uStack_ec8.data = (void *)(long)iVar2;
    auStack_ef8._0_8_ = (uv_loop_t *)0x0;
    if ((uv_handle_t *)uStack_ec8.data != (uv_handle_t *)0x0) goto LAB_001bfb25;
    auStack_ef8._0_8_ = (uv_loop_t *)0x1;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&uStack_ec8,auStack_ef8._20_4_,&uStack_ee0,1,-1,
                        (uv_fs_cb)0x0);
    auStack_ef8._8_8_ = SEXT48(iVar2);
    if (auStack_ef8._0_8_ != auStack_ef8._8_8_) goto LAB_001bfb34;
    auStack_ef8._0_8_ = (uv_loop_t *)0x1;
    auStack_ef8._8_8_ = uStack_ec8.result;
    if ((uv_loop_t *)uStack_ec8.result != (uv_loop_t *)0x1) goto LAB_001bfb43;
    uv_fs_req_cleanup(&uStack_ec8);
    puVar6 = uv_default_loop();
    iVar2 = uv_run(puVar6,UV_RUN_ONCE);
    auStack_ef8._0_8_ = SEXT48(iVar2);
    auStack_ef8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_ef8._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfb52;
    auStack_ef8._0_8_ = (uv_loop_t *)0x1;
    auStack_ef8._8_8_ = SEXT48(output_used);
    if ((uv_loop_t *)auStack_ef8._8_8_ != (uv_loop_t *)0x1) goto LAB_001bfb61;
    uv_close((uv_handle_t *)&uStack_d08,close_cb);
    auStack_ef8._0_8_ = (uv_loop_t *)0x1;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&uStack_ec8,auStack_ef8._20_4_,&uStack_ee0,1,-1,
                        (uv_fs_cb)0x0);
    auStack_ef8._8_8_ = SEXT48(iVar2);
    if (auStack_ef8._0_8_ != auStack_ef8._8_8_) goto LAB_001bfb70;
    auStack_ef8._0_8_ = (uv_loop_t *)0x1;
    auStack_ef8._8_8_ = uStack_ec8.result;
    if ((uv_loop_t *)uStack_ec8.result != (uv_loop_t *)0x1) goto LAB_001bfb7f;
    uv_fs_req_cleanup(&uStack_ec8);
    puVar6 = uv_default_loop();
    iVar2 = uv_timer_init(puVar6,&timer);
    auStack_ef8._0_8_ = SEXT48(iVar2);
    auStack_ef8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_ef8._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfb8e;
    iVar2 = uv_timer_start(&timer,timer_counter_cb,10,0);
    auStack_ef8._0_8_ = SEXT48(iVar2);
    auStack_ef8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_ef8._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfb9d;
    puVar6 = uv_default_loop();
    iVar2 = uv_run(puVar6,UV_RUN_ONCE);
    if (iVar2 == 1) {
      puVar6 = uv_default_loop();
      iVar2 = uv_run(puVar6,UV_RUN_ONCE);
      auStack_ef8._0_8_ = SEXT48(iVar2);
      auStack_ef8._8_8_ = (uv_loop_t *)0x0;
      if ((uv_loop_t *)auStack_ef8._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfbe8;
    }
    auStack_ef8._0_8_ = (uv_loop_t *)0x1;
    auStack_ef8._8_8_ = SEXT48(timer_counter);
    if ((uv_loop_t *)auStack_ef8._8_8_ != (uv_loop_t *)0x1) goto LAB_001bfbac;
    iVar2 = uv_process_kill(&process,0xf);
    auStack_ef8._0_8_ = SEXT48(iVar2);
    auStack_ef8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_ef8._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfbbb;
    iVar2 = close(auStack_ef8._20_4_);
    auStack_ef8._0_8_ = SEXT48(iVar2);
    auStack_ef8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_ef8._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfbca;
    auStack_ef8._20_4_ = -1;
    puVar6 = uv_default_loop();
    uv_walk(puVar6,close_walk_cb,(void *)0x0);
    uv_run(puVar6,UV_RUN_DEFAULT);
    auStack_ef8._0_8_ = (uv_loop_t *)0x0;
    puVar6 = uv_default_loop();
    iVar2 = uv_loop_close(puVar6);
    auStack_ef8._8_8_ = SEXT48(iVar2);
    if (auStack_ef8._0_8_ == auStack_ef8._8_8_) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_closed_fd_events_cold_1();
LAB_001bfaf5:
    run_test_closed_fd_events_cold_2();
LAB_001bfb07:
    run_test_closed_fd_events_cold_3();
LAB_001bfb16:
    run_test_closed_fd_events_cold_4();
LAB_001bfb25:
    run_test_closed_fd_events_cold_5();
LAB_001bfb34:
    run_test_closed_fd_events_cold_6();
LAB_001bfb43:
    run_test_closed_fd_events_cold_7();
LAB_001bfb52:
    run_test_closed_fd_events_cold_8();
LAB_001bfb61:
    run_test_closed_fd_events_cold_9();
LAB_001bfb70:
    run_test_closed_fd_events_cold_10();
LAB_001bfb7f:
    run_test_closed_fd_events_cold_11();
LAB_001bfb8e:
    run_test_closed_fd_events_cold_12();
LAB_001bfb9d:
    run_test_closed_fd_events_cold_13();
LAB_001bfbac:
    run_test_closed_fd_events_cold_15();
LAB_001bfbbb:
    run_test_closed_fd_events_cold_16();
LAB_001bfbca:
    run_test_closed_fd_events_cold_17();
  }
  run_test_closed_fd_events_cold_18();
LAB_001bfbe8:
  stream = (uv_stream_t *)auStack_ef8;
  nread = auStack_ef8 + 8;
  run_test_closed_fd_events_cold_14();
  uv_read_stop(stream);
  on_read(stream,(ssize_t)nread,buf);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(spawn_same_stdout_stderr) {
  uv_write_t write_req;
  uv_pipe_t in, out;
  uv_buf_t buf;
  uv_stdio_container_t stdio[3];
  int r;

  init_process_options("spawn_helper3", exit_cb);
  buf = uv_buf_init("TEST", 4);

  uv_pipe_init(uv_default_loop(), &out, 0);
  uv_pipe_init(uv_default_loop(), &in, 0);
  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*) &in;
  options.stdio[1].flags = UV_CREATE_PIPE | UV_WRITABLE_PIPE;
  options.stdio[1].data.stream = (uv_stream_t*) &out;
  options.stdio_count = 2;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT_OK(r);

  /* Sending signum == 0 should check if the
   * child process is still alive, not kill it.
   */
  r = uv_process_kill(&process, 0);
  ASSERT_OK(r);

  r = uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_cb);
  ASSERT_OK(r);

  r = uv_read_start((uv_stream_t*) &out, on_alloc, on_read);
  ASSERT_OK(r);

  ASSERT_OK(exit_cb_called);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_OK(strcmp(output, "TEST"));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}